

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray * __thiscall
QStringBuilder<char,_QByteArray>::convertTo<QByteArray>(QStringBuilder<char,_QByteArray> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  char *pcVar4;
  QByteArray *in_RSI;
  QStringBuilder<char,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QByteArray *s;
  iterator d;
  char **in_stack_ffffffffffffff98;
  QStringBuilder<char,_QByteArray> *size;
  Initialization in_stack_ffffffffffffffbc;
  qsizetype in_stack_ffffffffffffffc0;
  QByteArray *in_stack_ffffffffffffffc8;
  char *pcVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x7e00bc);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<char,_QByteArray>_>::size(in_RDI);
    (in_RDI->b).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->b).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    this_00 = QByteArray::data_ptr((QByteArray *)in_RDI);
    pcVar4 = QArrayDataPointer<char>::data(this_00);
    pcVar5 = pcVar4;
    QConcatenable<QStringBuilder<char,_QByteArray>_>::appendTo<char>
              (in_RDI,in_stack_ffffffffffffff98);
    if (qVar3 != (long)pcVar4 - (long)pcVar5) {
      QByteArray::resize(in_RSI,(qsizetype)size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)size;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }